

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

binary_op_t pugi::impl::anon_unknown_0::xpath_parser::binary_op_t::parse(xpath_lexer *lexer)

{
  char_t *pcVar1;
  char_t *pcVar2;
  ulong uVar3;
  size_t length;
  long lVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  binary_op_t bVar8;
  
  uVar3 = 0x400000000;
  iVar6 = 3;
  switch(lexer->_cur_lexeme) {
  case lex_equal:
    uVar5 = 3;
    break;
  case lex_not_equal:
    uVar5 = 4;
    break;
  case lex_less:
    uVar5 = 5;
    goto LAB_0012310a;
  case lex_greater:
    uVar5 = 6;
    goto LAB_0012310a;
  case lex_less_or_equal:
    uVar5 = 7;
    goto LAB_0012310a;
  case lex_greater_or_equal:
    uVar5 = 8;
LAB_0012310a:
    iVar6 = 4;
    break;
  case lex_plus:
    uVar5 = 9;
    goto LAB_00123124;
  case lex_minus:
    uVar5 = 10;
LAB_00123124:
    iVar6 = 5;
LAB_0012314b:
    uVar3 = 0x200000000;
    break;
  case lex_multiply:
    uVar5 = 0xb;
    iVar6 = 6;
    goto LAB_0012314b;
  case lex_union:
    uVar5 = 0xf;
    uVar3 = 0x100000000;
    iVar6 = 7;
    break;
  default:
switchD_00123003_caseD_b:
    iVar6 = 0;
    uVar3 = 0;
    uVar5 = 0;
    break;
  case lex_string:
    pcVar1 = (lexer->_cur_lexeme_contents).begin;
    pcVar2 = (lexer->_cur_lexeme_contents).end;
    lVar4 = (long)pcVar2 - (long)pcVar1;
    if (lVar4 != 0) {
      lVar7 = 0;
      do {
        if ("vendor"[lVar7 + 4] != pcVar1[lVar7]) goto LAB_0012304b;
        lVar7 = lVar7 + 1;
      } while (lVar4 != lVar7);
    }
    if ("vendor"[lVar4 + 4] == '\0') {
      uVar5 = 1;
      iVar6 = 1;
      break;
    }
LAB_0012304b:
    if (pcVar2 != pcVar1) {
      lVar7 = 0;
      do {
        if ("and"[lVar7] != pcVar1[lVar7]) goto LAB_0012307c;
        lVar7 = lVar7 + 1;
      } while (lVar4 != lVar7);
    }
    if ("and"[lVar4] == '\0') {
      uVar5 = 2;
      iVar6 = 2;
      break;
    }
LAB_0012307c:
    uVar3 = 0x200000000;
    if (pcVar2 != pcVar1) {
      lVar7 = 0;
      do {
        if ("div"[lVar7] != pcVar1[lVar7]) goto LAB_001230b7;
        lVar7 = lVar7 + 1;
      } while (lVar4 != lVar7);
    }
    if ("div"[lVar4] == '\0') {
      uVar5 = 0xc;
    }
    else {
LAB_001230b7:
      if (pcVar2 != pcVar1) {
        lVar7 = 0;
        do {
          if ("mod"[lVar7] != pcVar1[lVar7]) goto switchD_00123003_caseD_b;
          lVar7 = lVar7 + 1;
        } while (lVar4 != lVar7);
      }
      if ("mod"[lVar4] != '\0') goto switchD_00123003_caseD_b;
      uVar5 = 0xd;
    }
    iVar6 = 6;
  }
  bVar8._0_8_ = uVar3 | uVar5;
  bVar8.precedence = iVar6;
  return bVar8;
}

Assistant:

static binary_op_t parse(xpath_lexer& lexer)
			{
				switch (lexer.current())
				{
				case lex_string:
					if (lexer.contents() == PUGIXML_TEXT("or"))
						return binary_op_t(ast_op_or, xpath_type_boolean, 1);
					else if (lexer.contents() == PUGIXML_TEXT("and"))
						return binary_op_t(ast_op_and, xpath_type_boolean, 2);
					else if (lexer.contents() == PUGIXML_TEXT("div"))
						return binary_op_t(ast_op_divide, xpath_type_number, 6);
					else if (lexer.contents() == PUGIXML_TEXT("mod"))
						return binary_op_t(ast_op_mod, xpath_type_number, 6);
					else
						return binary_op_t();

				case lex_equal:
					return binary_op_t(ast_op_equal, xpath_type_boolean, 3);

				case lex_not_equal:
					return binary_op_t(ast_op_not_equal, xpath_type_boolean, 3);

				case lex_less:
					return binary_op_t(ast_op_less, xpath_type_boolean, 4);

				case lex_greater:
					return binary_op_t(ast_op_greater, xpath_type_boolean, 4);

				case lex_less_or_equal:
					return binary_op_t(ast_op_less_or_equal, xpath_type_boolean, 4);

				case lex_greater_or_equal:
					return binary_op_t(ast_op_greater_or_equal, xpath_type_boolean, 4);

				case lex_plus:
					return binary_op_t(ast_op_add, xpath_type_number, 5);

				case lex_minus:
					return binary_op_t(ast_op_subtract, xpath_type_number, 5);

				case lex_multiply:
					return binary_op_t(ast_op_multiply, xpath_type_number, 6);

				case lex_union:
					return binary_op_t(ast_op_union, xpath_type_node_set, 7);

				default:
					return binary_op_t();
				}
			}